

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::CLUFactor<double>::solveLleftForest
          (CLUFactor<double> *this,double eps,double *vec,int *nonz,int n)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  
  pdVar5 = (this->l).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->l).idx;
  piVar7 = (this->l).row;
  piVar8 = (this->l).start;
  iVar2 = (this->l).firstUpdate;
  lVar10 = (long)(this->l).firstUnused;
  while (lVar11 = lVar10, iVar2 < lVar11) {
    lVar10 = lVar11 + -1;
    dVar1 = vec[piVar7[lVar11 + -1]];
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      iVar3 = piVar8[lVar10];
      lVar12 = (long)iVar3 << 2;
      for (iVar9 = piVar8[lVar11]; iVar3 < iVar9; iVar9 = iVar9 + -1) {
        iVar4 = *(int *)((long)piVar6 + lVar12);
        dVar14 = vec[iVar4];
        dVar15 = *(double *)((long)pdVar5 + lVar12 * 2);
        if ((dVar14 != 0.0) || (NAN(dVar14))) {
          dVar14 = dVar14 - dVar15 * dVar1;
          uVar13 = -(ulong)(dVar14 != 0.0);
          vec[iVar4] = (double)(~uVar13 & 0x2b2bff2ee48e0530 | (ulong)dVar14 & uVar13);
        }
        else {
          dVar15 = dVar15 * -dVar1;
          if (eps < ABS(dVar15)) {
            vec[iVar4] = dVar15;
            lVar11 = (long)n;
            n = n + 1;
            nonz[lVar11] = iVar4;
          }
        }
        lVar12 = lVar12 + 4;
      }
    }
  }
  return n;
}

Assistant:

int CLUFactor<R>::solveLleftForest(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R x, y;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      assert(i >= 0 && i < l.size);

      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  nonz[n++] = m;
               }
            }
            else
            {
               y -= x * (*val++);
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}